

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O2

IGUIFont * __thiscall irr::gui::CGUIEnvironment::getFont(CGUIEnvironment *this,path *filename)

{
  array<irr::gui::CGUIEnvironment::SFont> *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  CGUIFont *this_01;
  double __x;
  SFont f;
  
  f.NamedPath.Path.str._M_dataplus._M_p = (pointer)&f.NamedPath.Path.str.field_2;
  f.NamedPath.Path.str._M_string_length = 0;
  f.NamedPath.Path.str.field_2._M_local_buf[0] = '\0';
  f.NamedPath.InternalName.str._M_dataplus._M_p = (pointer)&f.NamedPath.InternalName.str.field_2;
  f.NamedPath.InternalName.str._M_string_length = 0;
  f.NamedPath.InternalName.str.field_2._M_local_buf[0] = '\0';
  irr::io::SNamedPath::setPath(&f.NamedPath,filename);
  this_00 = &this->Fonts;
  uVar2 = core::array<irr::gui::CGUIEnvironment::SFont>::binary_search(this_00,&f);
  if (uVar2 == 0xffffffff) {
    iVar3 = (*this->FileSystem->_vptr_IFileSystem[0x1b])(this->FileSystem,filename);
    if ((char)iVar3 == '\0') {
      os::Printer::log(__x);
    }
    else {
      this_01 = (CGUIFont *)operator_new(0xb8);
      CGUIFont::CGUIFont(this_01,&this->super_IGUIEnvironment,(path *)&f);
      bVar1 = CGUIFont::load(this_01,(path *)&f);
      if (bVar1) {
        f.Font = (IGUIFont *)this_01;
        core::array<irr::gui::CGUIEnvironment::SFont>::push_back(this_00,&f);
        goto LAB_0022cde4;
      }
      IReferenceCounted::drop
                ((IReferenceCounted *)(&this_01->field_0x0 + *(long *)(*(long *)this_01 + -0x18)));
    }
    this_01 = (CGUIFont *)0x0;
  }
  else {
    this_01 = (CGUIFont *)
              (this_00->m_data).
              super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar2].Font;
  }
LAB_0022cde4:
  irr::io::SNamedPath::~SNamedPath(&f.NamedPath);
  return (IGUIFont *)this_01;
}

Assistant:

IGUIFont *CGUIEnvironment::getFont(const io::path &filename)
{
	// search existing font

	SFont f;
	f.NamedPath.setPath(filename);

	s32 index = Fonts.binary_search(f);
	if (index != -1)
		return Fonts[index].Font;

	// font doesn't exist, attempt to load it

	// does the file exist?

	if (!FileSystem->existFile(filename)) {
		os::Printer::log("Could not load font because the file does not exist", f.NamedPath.getPath(), ELL_ERROR);
		return 0;
	}

	IGUIFont *ifont = 0;
#if 0
		{
			CGUIFont* font = new CGUIFont(this, filename);
			ifont = (IGUIFont*)font;

			// load the font
			io::path directory;
			core::splitFilename(filename, &directory);
			if (!font->load(xml, directory))
			{
				font->drop();
				font  = 0;
				ifont = 0;
			}
		}
#endif

	if (!ifont) {

		CGUIFont *font = new CGUIFont(this, f.NamedPath.getPath());
		ifont = (IGUIFont *)font;
		if (!font->load(f.NamedPath.getPath())) {
			font->drop();
			return 0;
		}
	}

	// add to fonts.

	f.Font = ifont;
	Fonts.push_back(f);

	return ifont;
}